

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int aggregateIdxEprRefToColCallback(Walker *pWalker,Expr *pExpr)

{
  AggInfo_col *pAVar1;
  AggInfo_col *pCol;
  AggInfo *pAggInfo;
  Expr *pExpr_local;
  Walker *pWalker_local;
  int local_4;
  
  if (pExpr->pAggInfo == (AggInfo *)0x0) {
    local_4 = 0;
  }
  else if (pExpr->op == 0xaa) {
    local_4 = 0;
  }
  else if (pExpr->op == 0xa9) {
    local_4 = 0;
  }
  else if (pExpr->op == 0xb3) {
    local_4 = 0;
  }
  else if ((int)pExpr->iAgg < pExpr->pAggInfo->nColumn) {
    pAVar1 = pExpr->pAggInfo->aCol;
    pExpr->op = 0xaa;
    pExpr->iTable = pAVar1[pExpr->iAgg].iTable;
    pExpr->iColumn = pAVar1[pExpr->iAgg].iColumn;
    pExpr->flags = pExpr->flags & 0xfff7ddff;
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int aggregateIdxEprRefToColCallback(Walker *pWalker, Expr *pExpr){
  AggInfo *pAggInfo;
  struct AggInfo_col *pCol;
  UNUSED_PARAMETER(pWalker);
  if( pExpr->pAggInfo==0 ) return WRC_Continue;
  if( pExpr->op==TK_AGG_COLUMN ) return WRC_Continue;
  if( pExpr->op==TK_AGG_FUNCTION ) return WRC_Continue;
  if( pExpr->op==TK_IF_NULL_ROW ) return WRC_Continue;
  pAggInfo = pExpr->pAggInfo;
  if( NEVER(pExpr->iAgg>=pAggInfo->nColumn) ) return WRC_Continue;
  assert( pExpr->iAgg>=0 );
  pCol = &pAggInfo->aCol[pExpr->iAgg];
  pExpr->op = TK_AGG_COLUMN;
  pExpr->iTable = pCol->iTable;
  pExpr->iColumn = pCol->iColumn;
  ExprClearProperty(pExpr, EP_Skip|EP_Collate|EP_Unlikely);
  return WRC_Prune;
}